

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void __thiscall
re2c::OutputFile::emit
          (OutputFile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types,size_t max_fill)

{
  pointer ppOVar1;
  OutputBlock *pOVar2;
  long lVar3;
  OutputFragment *this_00;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  string content;
  
  if (this->file != (FILE *)0x0) {
    iVar6 = 1;
    uVar5 = 0;
    while( true ) {
      ppOVar1 = (this->blocks).
                super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->blocks).
                        super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3) <=
          (ulong)uVar5) break;
      pOVar2 = ppOVar1[uVar5];
      uVar7 = 0;
      while( true ) {
        lVar3 = *(long *)&(pOVar2->fragments).
                          super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                          ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pOVar2->fragments).
                                   super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>
                                   ._M_impl + 8) - lVar3 >> 3) <= (ulong)uVar7) break;
        this_00 = *(OutputFragment **)(lVar3 + (ulong)uVar7 * 8);
        switch(this_00->type) {
        case LINE_INFO:
          output_line_info((ostream *)&this_00->stream,iVar6 + 1,this->file_name);
          break;
        case STATE_GOTO:
          output_state_goto((ostream *)&this_00->stream,this_00->indent,0);
          break;
        case TYPES:
          output_types((ostream *)&this_00->stream,this_00->indent,types);
          break;
        case WARN_CONDITION_ORDER:
          if (this->warn_condition_order == true) {
            Warn::condition_order((Warn *)warn,pOVar2->line);
          }
          break;
        case YYACCEPT_INIT:
          output_yyaccept_init((ostream *)&this_00->stream,this_00->indent,pOVar2->used_yyaccept);
          break;
        case YYMAXFILL:
          output_yymaxfill((ostream *)&this_00->stream,max_fill);
        }
        std::__cxx11::stringbuf::str();
        fwrite(content._M_dataplus._M_p,1,content._M_string_length,(FILE *)this->file);
        uVar4 = OutputFragment::count_lines(this_00);
        iVar6 = uVar4 + iVar6;
        std::__cxx11::string::~string((string *)&content);
        uVar7 = uVar7 + 1;
      }
      uVar5 = uVar5 + 1;
    }
  }
  return;
}

Assistant:

void OutputFile::emit
	( const std::vector<std::string> & types
	, size_t max_fill
	)
{
	if (file != NULL)
	{
		unsigned int line_count = 1;
		for (unsigned int j = 0; j < blocks.size (); ++j)
		{
			OutputBlock & b = * blocks[j];
			for (unsigned int i = 0; i < b.fragments.size (); ++i)
			{
				OutputFragment & f = * b.fragments[i];
				switch (f.type)
				{
					case OutputFragment::CODE:
						break;
					case OutputFragment::LINE_INFO:
						output_line_info (f.stream, line_count + 1, file_name);
						break;
					case OutputFragment::STATE_GOTO:
						output_state_goto (f.stream, f.indent, 0);
						break;
					case OutputFragment::TYPES:
						output_types (f.stream, f.indent, types);
						break;
					case OutputFragment::WARN_CONDITION_ORDER:
						if (warn_condition_order) // see note [condition order]
						{
							warn.condition_order (b.line);
						}
						break;
					case OutputFragment::YYACCEPT_INIT:
						output_yyaccept_init (f.stream, f.indent, b.used_yyaccept);
						break;
					case OutputFragment::YYMAXFILL:
						output_yymaxfill (f.stream, max_fill);
						break;
				}
				std::string content = f.stream.str ();
				fwrite (content.c_str (), 1, content.size (), file);
				line_count += f.count_lines ();
			}
		}
	}
}